

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampling.h
# Opt level: O0

Float __thiscall
pbrt::PiecewiseConstant1D::Sample(PiecewiseConstant1D *this,Float u,Float *pdf,int *off)

{
  float fVar1;
  int iVar2;
  size_t sVar3;
  const_reference pvVar4;
  int *in_RDX;
  float *in_RSI;
  vector<float,_pstd::pmr::polymorphic_allocator<float>_> *in_RDI;
  float in_XMM0_Da;
  Float FVar5;
  undefined1 auVar6 [16];
  Float du;
  int offset;
  float local_58;
  float local_3c;
  float local_c [3];
  
  local_c[0] = in_XMM0_Da;
  pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::size(in_RDI + 1);
  sVar3 = FindInterval<pbrt::PiecewiseConstant1D::Sample(float,float*,int*)const::_lambda(int)_1_>
                    ((size_t)local_c,(anon_class_16_2_fd512de2 *)in_RDI);
  iVar2 = (int)sVar3;
  if (in_RDX != (int *)0x0) {
    *in_RDX = iVar2;
  }
  pvVar4 = pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::operator[]
                     (in_RDI + 1,(long)iVar2);
  local_3c = local_c[0] - *pvVar4;
  pvVar4 = pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::operator[]
                     (in_RDI + 1,(long)(iVar2 + 1));
  fVar1 = *pvVar4;
  pvVar4 = pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::operator[]
                     (in_RDI + 1,(long)iVar2);
  auVar6 = (undefined1  [16])0x0;
  if (0.0 < fVar1 - *pvVar4) {
    pvVar4 = pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::operator[]
                       (in_RDI + 1,(long)(iVar2 + 1));
    fVar1 = *pvVar4;
    pvVar4 = pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::operator[]
                       (in_RDI + 1,(long)iVar2);
    auVar6 = ZEXT416((uint)(fVar1 - *pvVar4));
    local_3c = local_3c / (fVar1 - *pvVar4);
  }
  if (in_RSI != (float *)0x0) {
    auVar6 = (undefined1  [16])0x0;
    if (*(float *)&in_RDI[2].ptr <= 0.0) {
      local_58 = 0.0;
    }
    else {
      auVar6 = (undefined1  [16])0x0;
      pvVar4 = pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::operator[]
                         (in_RDI,(long)iVar2);
      local_58 = *pvVar4 / *(float *)&in_RDI[2].ptr;
    }
    *in_RSI = local_58;
  }
  sVar3 = size((PiecewiseConstant1D *)0x4d4379);
  auVar6 = vcvtusi2ss_avx512f(auVar6,sVar3);
  FVar5 = Lerp(((float)iVar2 + local_3c) / auVar6._0_4_,*(Float *)&in_RDI[2].alloc.memoryResource,
               *(Float *)((long)&in_RDI[2].alloc.memoryResource + 4));
  return FVar5;
}

Assistant:

PBRT_CPU_GPU
    Float Sample(Float u, Float *pdf = nullptr, int *off = nullptr) const {
        // Find surrounding CDF segments and _offset_
        int offset =
            FindInterval((int)cdf.size(), [&](int index) { return cdf[index] <= u; });
        if (off)
            *off = offset;

        // Compute offset along CDF segment
        Float du = u - cdf[offset];
        if (cdf[offset + 1] - cdf[offset] > 0)
            du /= cdf[offset + 1] - cdf[offset];
        DCHECK(!IsNaN(du));

        // Compute PDF for sampled offset
        if (pdf != nullptr)
            *pdf = (funcInt > 0) ? func[offset] / funcInt : 0;

        // Return $x$ corresponding to sample
        return Lerp((offset + du) / size(), min, max);
    }